

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O3

void __thiscall StackString<32UL,_char16_t>::Resize(StackString<32UL,_char16_t> *this,SIZE_T count)

{
  if ((StackString<32UL,_char16_t> *)this->m_buffer == (StackString<32UL,_char16_t> *)0x0) {
    if (0x20 < count) goto LAB_001295e8;
    this->m_size = 0x21;
    this->m_buffer = this->m_innerBuffer;
    this->m_count = count;
  }
  else {
    if (((StackString<32UL,_char16_t> *)this->m_buffer != this) || (0x20 < count)) {
LAB_001295e8:
      ReallocateBuffer(this,count);
      return;
    }
    this->m_count = count;
    this->m_size = 0x21;
  }
  return;
}

Assistant:

void Resize(SIZE_T count)
    {
        if (NULL == m_buffer)
        {
            if (count > STACKCOUNT)
            {
                ReallocateBuffer(count);
            }
            else
            {
                m_size = STACKCOUNT+1;
                m_buffer = m_innerBuffer;
                m_count = count;
            }
        }
        else if (m_innerBuffer == m_buffer)
        {
            if (count > STACKCOUNT)
            {
                ReallocateBuffer(count);
            }
            else
            {
                m_count = count;
                m_size = STACKCOUNT+1;
            }
        }
        else
        {
            ReallocateBuffer(count);
        }

        return;
    }